

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall
gulcalc::writemode0output
          (gulcalc *this,item_map_rec *er,OASIS_FLOAT tiv,int event_id,int bin_index,
          OASIS_FLOAT rval,probrec *p,int sample_id,bool correlated)

{
  const_reference pvVar1;
  int iVar2;
  undefined1 local_94 [8];
  gulcoverageSampleslevel ggc;
  damagebindictionary b;
  gulitemSampleslevel gg;
  gulGulSamples g;
  bool correlated_local;
  int sample_id_local;
  probrec *p_local;
  OASIS_FLOAT rval_local;
  int bin_index_local;
  int event_id_local;
  OASIS_FLOAT tiv_local;
  item_map_rec *er_local;
  gulcalc *this_local;
  
  gg.loss = (OASIS_FLOAT)er->item_id;
  iVar2 = sample_id + 1;
  gg.sidx = event_id;
  pvVar1 = std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::operator[]
                     (this->damagebindictionary_vec_,(long)bin_index);
  ggc.sidx = pvVar1->bin_index;
  ggc.loss = pvVar1->bin_from;
  b.bin_index = (int)pvVar1->bin_to;
  b.bin_from = pvVar1->interpolation;
  b.bin_to = (OASIS_FLOAT)pvVar1->interval_type;
  gg.item_id = (int)rval;
  if ((this->debug_ & 1U) == 0) {
    gg.item_id = (int)getgul(this,(damagebindictionary *)&ggc.sidx,(gulGulSamples *)&gg.sidx);
  }
  b.interpolation = (OASIS_FLOAT)gg.sidx;
  b.interval_type = (int)gg.loss;
  if (this->loss_threshold_ <= (double)(float)gg.item_id) {
    gg.event_id = iVar2;
    if (correlated) {
      correlatedoutputgul(this,(gulitemSampleslevel *)&b.interpolation);
    }
    else {
      itemoutputgul(this,(gulitemSampleslevel *)&b.interpolation);
    }
    if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) {
      ggc.coverage_id = gg.item_id;
      local_94._4_4_ = er->coverage_id;
      local_94._0_4_ = gg.sidx;
      ggc.event_id = iVar2;
      gencovoutput(this,(gulcoverageSampleslevel *)local_94);
    }
  }
  return;
}

Assistant:

void gulcalc::writemode0output(const item_map_rec &er, const OASIS_FLOAT tiv,
			       const int event_id, const int bin_index,
			       const OASIS_FLOAT rval, const probrec &p,
			       const int sample_id,
			       const bool correlated=false) {

	gulGulSamples g;
	g.event_id = event_id;
	g.item_id = er.item_id;
	g.tiv = tiv;
	g.bin_index = bin_index;
	g.prob_from = p.prob_from;
	g.prob_to = p.prob_to;
	g.bin_mean = p.bin_mean;
	g.rval = rval;
	g.sidx = sample_id + 1;

	gulitemSampleslevel gg;
	damagebindictionary b = (*damagebindictionary_vec_)[g.bin_index];
	if (debug_) gg.loss = rval;
	else gg.loss = getgul(b, g);

	gg.sidx = g.sidx;
	gg.event_id = g.event_id;
	gg.item_id = g.item_id;
	if (gg.loss >= loss_threshold_) {

		if (correlated) correlatedoutputgul(gg);
		else itemoutputgul(gg);

		if (!correlatedWriter_) {
			gulcoverageSampleslevel ggc;
			ggc.loss = gg.loss;
			ggc.sidx = g.sidx;
			ggc.coverage_id = er.coverage_id;
			ggc.event_id = g.event_id;
			gencovoutput(ggc);
		}

	}

}